

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadVertexData(ColladaParser *this,Mesh *pMesh)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ostream *poVar4;
  char *local_1d0;
  string local_1c8;
  string local_1a8 [11];
  
  GetAttribute(this,"id");
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])();
  pcVar1 = (char *)(pMesh->mVertexID)._M_string_length;
  strlen((char *)CONCAT44(extraout_var,iVar2));
  std::__cxx11::string::_M_replace((ulong)&pMesh->mVertexID,0,pcVar1,CONCAT44(extraout_var,iVar2));
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar2 != '\0') {
    do {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 1) {
        if (iVar3 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"input");
        if (iVar2 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Unexpected sub element <",0x18);
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          local_1d0 = (char *)CONCAT44(extraout_var_02,iVar2);
          poVar4 = (ostream *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                              local_1a8,&local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"> in tag <vertices>",0x13);
          std::__cxx11::stringbuf::str();
          ThrowException(this,&local_1c8);
        }
        ReadInputChannel(this,&pMesh->mPerVertexData);
      }
      else if (iVar3 == 2) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_01,iVar2),"vertices");
        if (iVar2 == 0) {
          return;
        }
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"Expected end of <vertices> element.","");
        ThrowException(this,local_1a8);
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar2 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadVertexData(Mesh* pMesh)
{
    // extract the ID of the <vertices> element. Not that we care, but to catch strange referencing schemes we should warn about
    int attrID = GetAttribute("id");
    pMesh->mVertexID = mReader->getAttributeValue(attrID);

    // a number of <input> elements
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("input"))
            {
                ReadInputChannel(pMesh->mPerVertexData);
            }
            else
            {
                ThrowException(format() << "Unexpected sub element <" << mReader->getNodeName() << "> in tag <vertices>");
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "vertices") != 0)
                ThrowException("Expected end of <vertices> element.");

            break;
        }
    }
}